

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH_errorcode XXH3_freeState(XXH3_state_t *statePtr)

{
  if (statePtr != (XXH3_state_t *)0x0) {
    free((void *)((long)statePtr - (ulong)*(byte *)((long)&statePtr[-1].extSecret + 7)));
  }
  return XXH_OK;
}

Assistant:

static void XXH_alignedFree(void* p)
{
    if (p != NULL) {
        xxh_u8* ptr = (xxh_u8*)p;
        /* Get the offset byte we added in XXH_malloc. */
        xxh_u8 offset = ptr[-1];
        /* Free the original malloc'd pointer */
        xxh_u8* base = ptr - offset;
        XXH_free(base);
    }
}